

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrElse.cpp
# Opt level: O0

void __thiscall FactoredQLastTimeStepOrElse::Initialize(FactoredQLastTimeStepOrElse *this)

{
  ostream *this_00;
  PlanningUnitFactoredDecPOMDPDiscrete *pPVar1;
  FactoredDecPOMDPDiscreteInterface *pFVar2;
  pointer puVar3;
  value_type *in_RDI;
  Index e;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar4;
  
  this_00 = std::operator<<((ostream *)&std::cout,"FactoredQLastTimeStepOrElse::Initialize()");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pPVar1 = (PlanningUnitFactoredDecPOMDPDiscrete *)
           (**(code **)((in_RDI->super_SDT).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 0x1e))
                     (&(in_RDI->super_SDT).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  pFVar2 = PlanningUnitFactoredDecPOMDPDiscrete::GetFDPOMDPD(pPVar1);
  puVar3 = (pointer)(**(code **)(*(long *)pFVar2 + 0xf8))();
  in_RDI[2].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar3;
  std::vector<Scope,_std::allocator<Scope>_>::clear
            ((vector<Scope,_std::allocator<Scope>_> *)0x8dad6e);
  for (uVar4 = 0;
      (pointer)(ulong)uVar4 !=
      in_RDI[2].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start; uVar4 = uVar4 + 1) {
    pPVar1 = (PlanningUnitFactoredDecPOMDPDiscrete *)
             (**(code **)((in_RDI->super_SDT).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 0x1e))
                       (&(in_RDI->super_SDT).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    pFVar2 = PlanningUnitFactoredDecPOMDPDiscrete::GetFDPOMDPD(pPVar1);
    (**(code **)(*(long *)pFVar2 + 0x108))(pFVar2,uVar4);
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              ((vector<Scope,_std::allocator<Scope>_> *)CONCAT44(uVar4,in_stack_fffffffffffffff0),
               in_RDI);
  }
  *(undefined1 *)
   &in_RDI[1].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 1;
  return;
}

Assistant:

void FactoredQLastTimeStepOrElse::Initialize()
{
    cout << "FactoredQLastTimeStepOrElse::Initialize()"<<endl;
    _m_nrLRFs=GetPUF()->GetFDPOMDPD()->GetNrLRFs();
    _m_agentScopes.clear();
    for(Index e=0;e!=_m_nrLRFs;++e)
        _m_agentScopes.push_back(GetPUF()->GetFDPOMDPD()->GetAgentScopeForLRF(e));
    _m_initialized = true;
}